

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

treeNode * simpleExp(void)

{
  bool bVar1;
  treeNode *ptVar2;
  treeNode *ptVar3;
  allocator local_82;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  ptVar2 = term();
  std::__cxx11::string::string((string *)&local_80,"+",&local_81);
  bVar1 = match(&local_80,Empty);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,"-",&local_82);
    bVar1 = match(&local_40,Empty);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_80);
    if (!bVar1) {
      return ptVar2;
    }
  }
  ptVar3 = (treeNode *)operator_new(0x58);
  (ptVar3->lineNo).row = 0;
  (ptVar3->lineNo).col = 0;
  ptVar3->nodeKind = statement;
  ptVar3->kind = (Kind)0x0;
  ptVar3->child[0] = (treeNode *)0x0;
  ptVar3->child[1] = (treeNode *)0x0;
  ptVar3->child[2] = (treeNode *)0x0;
  ptVar3->sibling = (treeNode *)0x0;
  (ptVar3->text)._M_dataplus._M_p = (pointer)&(ptVar3->text).field_2;
  (ptVar3->text)._M_string_length = 0;
  (ptVar3->text).field_2._M_local_buf[0] = '\0';
  ptVar3->attrKind = Text;
  ptVar3->nodeKind = expression;
  ptVar3->kind = (Kind)0x3;
  ptVar3->child[0] = ptVar2;
  ptVar2 = (treeNode *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_60,(string *)&preToken.text);
  treeNode::treeNode(ptVar2,opExp,&local_60);
  ptVar3->child[1] = ptVar2;
  std::__cxx11::string::~string((string *)&local_60);
  ptVar2 = simpleExp();
  ptVar3->child[2] = ptVar2;
  return ptVar3;
}

Assistant:

treeNode* simpleExp()
{
    auto pterm=term();
    if(match("+")||match("-"))
    {
        treeNode* ret=new treeNode(NodeKind::expression);
        ret->child[0]=pterm;
        ret->child[1]=new treeNode(ExpKind::opExp,preToken.text);
        ret->child[2]=simpleExp();
        return ret;
    }
    else
    {
        return pterm;
    }
}